

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O0

NamedVertex * __thiscall
gss::innards::HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_(HomomorphismModel *this,int v)

{
  pointer pIVar1;
  size_type sVar2;
  ProofError *this_00;
  uint in_EDX;
  NamedVertex *in_RDI;
  string *in_stack_ffffffffffffff78;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  if (-1 < (int)in_EDX) {
    pIVar1 = std::
             unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           *)0x142e29);
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&pIVar1->pattern_vertex_proof_names);
    if (in_EDX < sVar2) {
      pIVar1 = std::
               unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                             *)0x142f06);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&pIVar1->pattern_vertex_proof_names,(long)(int)in_EDX);
      std::
      pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      pair<int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (in_stack_ffffffffffffff80,(int *)in_stack_ffffffffffffff78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x142f2c);
      return in_RDI;
    }
  }
  uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffffb0);
  this_00 = (ProofError *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffffb4,uVar3));
  ProofError::ProofError(this_00,in_stack_ffffffffffffff78);
  __cxa_throw(this_00,&ProofError::typeinfo,ProofError::~ProofError);
}

Assistant:

auto HomomorphismModel::pattern_vertex_for_proof(int v) const -> NamedVertex
{
    if (v < 0 || unsigned(v) >= _imp->pattern_vertex_proof_names.size())
        throw ProofError{"Oops, there's a bug: v out of range in pattern"};
    return pair{v, _imp->pattern_vertex_proof_names[v]};
}